

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaANCF_3843::EvaluateElementFrame
          (ChElementHexaANCF_3843 *this,double xi,double eta,double zeta,ChVector<double> *point,
          ChQuaternion<double> *rot)

{
  Matrix3xN *ebar;
  ChVector<double> Ydir;
  ChMatrix33<double> msect;
  ChVector<double> Xdir;
  VectorN Sxi_eta_compact;
  VectorN Sxi_xi_compact;
  VectorN Sxi_compact;
  Matrix3xN e_bar;
  int local_734;
  Matrix3xN *local_730;
  VectorN *local_728;
  ChVector<double> local_720;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_Eigen::Matrix<double,_32,_1,_0,_32,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_708;
  Matrix3xN *local_6e0;
  LhsNested local_6d8;
  ChVector<double> local_698;
  VectorN local_680;
  VectorN local_580;
  undefined1 local_480 [1104];
  
  Calc_Sxi_compact(this,(VectorN *)local_480,xi,eta,zeta);
  Calc_Sxi_xi_compact(this,&local_580,xi,eta,zeta);
  Calc_Sxi_eta_compact(this,&local_680,xi,eta,zeta);
  ebar = (Matrix3xN *)(local_480 + 0x100);
  CalcCoordMatrix(this,ebar);
  local_6e0 = ebar;
  local_6d8 = (LhsNested)local_480;
  ChVector<double>::operator=
            (point,(MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_Eigen::Matrix<double,_32,_1,_0,_32,_1>,_0>_>
                    *)&local_6e0);
  local_730 = (Matrix3xN *)CONCAT44(local_730._4_4_,2);
  local_720.m_data[0] = (double)ebar;
  local_720.m_data[1] = (double)&local_580;
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Matrix<double,3,32,1,3,32>,Eigen::Matrix<double,32,1,0,32,1>,0>>
  ::operator*(&local_708,
              (MatrixBase<Eigen::Product<Eigen::Matrix<double,3,32,1,3,32>,Eigen::Matrix<double,32,1,0,32,1>,0>>
               *)&local_720,(int *)&local_730);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,32,1,3,32>,Eigen::Matrix<double,32,1,0,32,1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
  ::operator/((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_Eigen::Matrix<double,_32,_1,_0,_32,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)&local_6e0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,32,1,3,32>,Eigen::Matrix<double,32,1,0,32,1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
               *)&local_708,&this->m_lenX);
  ChVector<double>::
  ChVector<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,32,1,3,32>,Eigen::Matrix<double,32,1,0,32,1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (&local_698,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_Eigen::Matrix<double,_32,_1,_0,_32,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)&local_6e0,(type *)0x0);
  local_728 = &local_680;
  local_734 = 2;
  local_730 = ebar;
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Matrix<double,3,32,1,3,32>,Eigen::Matrix<double,32,1,0,32,1>,0>>
  ::operator*(&local_708,
              (MatrixBase<Eigen::Product<Eigen::Matrix<double,3,32,1,3,32>,Eigen::Matrix<double,32,1,0,32,1>,0>>
               *)&local_730,&local_734);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,32,1,3,32>,Eigen::Matrix<double,32,1,0,32,1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
  ::operator/((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_Eigen::Matrix<double,_32,_1,_0,_32,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)&local_6e0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,32,1,3,32>,Eigen::Matrix<double,32,1,0,32,1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
               *)&local_708,&this->m_lenY);
  ChVector<double>::
  ChVector<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,32,1,3,32>,Eigen::Matrix<double,32,1,0,32,1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (&local_720,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_Eigen::Matrix<double,_32,_1,_0,_32,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)&local_6e0,(type *)0x0);
  ChMatrix33<double>::Set_A_Xdir((ChMatrix33<double> *)&local_6e0,&local_698,&local_720);
  ChMatrix33<double>::Get_A_quaternion
            ((ChQuaternion<double> *)&local_708,(ChMatrix33<double> *)&local_6e0);
  ChQuaternion<double>::operator=(rot,(ChQuaternion<double> *)&local_708);
  return;
}

Assistant:

void ChElementHexaANCF_3843::EvaluateElementFrame(const double xi,
                                                  const double eta,
                                                  const double zeta,
                                                  ChVector<>& point,
                                                  ChQuaternion<>& rot) {
    VectorN Sxi_compact;
    Calc_Sxi_compact(Sxi_compact, xi, eta, zeta);
    VectorN Sxi_xi_compact;
    Calc_Sxi_xi_compact(Sxi_xi_compact, xi, eta, zeta);
    VectorN Sxi_eta_compact;
    Calc_Sxi_eta_compact(Sxi_eta_compact, xi, eta, zeta);

    Matrix3xN e_bar;
    CalcCoordMatrix(e_bar);

    // r = S*e written in compact form
    point = e_bar * Sxi_compact;

    // Since ANCF does not use rotations, calculate an approximate
    // rotation based off the position vector gradients
    ChVector<double> Xdir = e_bar * Sxi_xi_compact * 2 / m_lenX;
    ChVector<double> Ydir = e_bar * Sxi_eta_compact * 2 / m_lenY;

    // Since the position vector gradients are not in general orthogonal,
    // set the Dx direction tangent to the brick xi axis and
    // compute the Dy and Dz directions by using a
    // Gram-Schmidt orthonormalization, guided by the brick eta axis
    ChMatrix33<> msect;
    msect.Set_A_Xdir(Xdir, Ydir);

    rot = msect.Get_A_quaternion();
}